

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O3

bool __thiscall
CLIntercept::checkRelaxAllocationLimitsSupport
          (CLIntercept *this,cl_uint numDevices,cl_device_id *deviceList)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  bool bVar6;
  cl_uint deviceVendorId;
  cl_device_type deviceType;
  int local_4c;
  ulong local_48;
  long local_40;
  ulong local_38;
  
  if (numDevices == 0) {
    return true;
  }
  local_38 = (ulong)numDevices;
  local_40 = -local_38;
  bVar6 = false;
  uVar4 = 1;
  uVar5 = 0;
  do {
    local_48 = 0;
    uVar1 = (*(this->m_Dispatch).clGetDeviceInfo)
                      (deviceList[uVar4 - 1],0x1000,8,&local_48,(size_t *)0x0);
    uVar2 = (*(this->m_Dispatch).clGetDeviceInfo)
                      (deviceList[uVar4 - 1],0x1001,4,&local_4c,(size_t *)0x0);
    uVar5 = uVar5 | uVar1 | uVar2;
    if (((local_48 & 4) == 0) || (local_4c != 0x8086)) break;
    bVar6 = local_38 <= uVar4;
    lVar3 = local_40 + uVar4;
    uVar4 = uVar4 + 1;
  } while (lVar3 != 0);
  return (bool)(uVar5 == 0 & bVar6);
}

Assistant:

bool CLIntercept::checkRelaxAllocationLimitsSupport(
    cl_uint numDevices,
    const cl_device_id* deviceList ) const
{
    cl_int  errorCode = CL_SUCCESS;
    bool    supported = true;

    // For now, check for Intel GPU devices to determine whether relaxed
    // allocations are supported.  Eventually this can be checked using
    // formal mechanisms.

    for( cl_uint i = 0; i < numDevices; i++ )
    {
        cl_device_type  deviceType = 0;
        cl_uint deviceVendorId;

        errorCode |= dispatch().clGetDeviceInfo(
            deviceList[ i ],
            CL_DEVICE_TYPE,
            sizeof( deviceType ),
            &deviceType,
            NULL );
        errorCode |= dispatch().clGetDeviceInfo(
            deviceList[ i ],
            CL_DEVICE_VENDOR_ID,
            sizeof( deviceVendorId ),
            &deviceVendorId,
            NULL );
        if( ( deviceType & CL_DEVICE_TYPE_GPU ) == 0 ||
            deviceVendorId != 0x8086 )
        {
            supported = false;
            break;
        }
    }

    return ( errorCode == CL_SUCCESS ) && supported;
}